

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O1

float tinyobj::parseFloat(char **token)

{
  byte *pbVar1;
  byte bVar2;
  char *__s;
  bool bVar3;
  long lVar4;
  size_t sVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  byte *pbVar9;
  byte *pbVar10;
  int iVar11;
  bool bVar12;
  double dVar13;
  double dVar14;
  float fVar15;
  double local_48;
  
  __s = *token;
  sVar5 = strspn(__s," \t");
  pbVar9 = (byte *)(__s + sVar5);
  *token = (char *)pbVar9;
  sVar5 = strcspn((char *)pbVar9," \t\r");
  pbVar1 = pbVar9 + sVar5;
  fVar15 = 0.0;
  if ((long)sVar5 < 1) goto LAB_00120e12;
  bVar2 = *pbVar9;
  if ((bVar2 == 0x2d) || (bVar2 == 0x2b)) {
    pbVar9 = pbVar9 + 1;
    dVar13 = *(double *)(&DAT_0018bf70 + (ulong)(bVar2 == 0x2b) * 8);
  }
  else {
    if (9 < (int)(char)bVar2 - 0x30U) goto LAB_00120e12;
    dVar13 = 1.0;
  }
  local_48 = 0.0;
  bVar12 = pbVar9 == pbVar1;
  pbVar10 = pbVar9;
  if (bVar12) {
    bVar3 = true;
  }
  else {
    uVar6 = (int)(char)*pbVar9 - 0x30;
    bVar3 = uVar6 >= 10;
    if (uVar6 < 10) {
      do {
        pbVar9 = pbVar9 + 1;
        local_48 = (double)(int)uVar6 + local_48 * 10.0;
        bVar12 = pbVar9 == pbVar1;
        pbVar10 = pbVar1;
        if (bVar12) break;
        uVar6 = (int)(char)*pbVar9 - 0x30;
        pbVar10 = pbVar9;
      } while (uVar6 < 10);
    }
    else {
      bVar12 = false;
    }
  }
  if (bVar3) goto LAB_00120e12;
  iVar11 = 0;
  if (!bVar12) {
    bVar2 = *pbVar10;
    bVar3 = true;
    bVar12 = bVar3;
    if ((bVar2 != 0x65) && (bVar2 != 0x45)) {
      if (bVar2 != 0x2e) goto LAB_00120ddf;
      pbVar9 = pbVar10 + 1;
      bVar12 = pbVar9 != pbVar1;
      pbVar10 = pbVar9;
      if (bVar12) {
        iVar8 = -1;
        do {
          bVar2 = *pbVar9;
          pbVar10 = pbVar9;
          bVar12 = bVar3;
          if (9 < (int)(char)bVar2 - 0x30U) break;
          dVar14 = pow(10.0,(double)iVar8);
          local_48 = local_48 + dVar14 * (double)(int)((int)(char)bVar2 - 0x30U);
          pbVar9 = pbVar9 + 1;
          iVar8 = iVar8 + -1;
          bVar12 = pbVar9 != pbVar1;
          pbVar10 = pbVar1;
        } while (bVar12);
      }
    }
    fVar15 = 0.0;
    if ((bVar12) && ((*pbVar10 | 0x20) == 0x65)) {
      pbVar9 = pbVar10 + 1;
      if ((pbVar9 == pbVar1) || ((bVar2 = *pbVar9, bVar2 != 0x2d && (bVar2 != 0x2b)))) {
        iVar8 = 1;
        if (9 < (int)(char)*pbVar9 - 0x30U) goto LAB_00120e12;
      }
      else {
        pbVar9 = pbVar10 + 2;
        iVar8 = (uint)(bVar2 == 0x2b) * 2 + -1;
      }
      if (pbVar9 == pbVar1) {
        bVar12 = true;
        iVar11 = 0;
      }
      else {
        lVar7 = 0;
        iVar11 = 0;
        do {
          if (9 < (int)(char)pbVar9[lVar7] - 0x30U) goto LAB_00120e69;
          iVar11 = ((int)(char)pbVar9[lVar7] - 0x30U) + iVar11 * 10;
          lVar4 = lVar7 + 1;
          lVar7 = lVar7 + 1;
        } while (pbVar9 + lVar4 != pbVar1);
        lVar7 = 1;
LAB_00120e69:
        bVar12 = (int)lVar7 == 0;
      }
      if (bVar12) goto LAB_00120e12;
      iVar11 = iVar11 * iVar8;
    }
  }
LAB_00120ddf:
  dVar14 = pow(5.0,(double)iVar11);
  dVar14 = ldexp(dVar14 * local_48,iVar11);
  fVar15 = (float)(dVar13 * dVar14);
LAB_00120e12:
  *token = (char *)pbVar1;
  return fVar15;
}

Assistant:

static inline float parseFloat(const char *&token) {
  token += strspn(token, " \t");
#ifdef TINY_OBJ_LOADER_OLD_FLOAT_PARSER
  float f = (float)atof(token);
  token += strcspn(token, " \t\r");
#else
  const char *end = token + strcspn(token, " \t\r");
  double val = 0.0;
  tryParseDouble(token, end, &val);
  float f = static_cast<float>(val);
  token = end;
#endif
  return f;
}